

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.cc
# Opt level: O3

bool S2ShapeIndexCell::DecodeEdges(int num_edges,S2ClippedShape *clipped,Decoder *decoder)

{
  byte *pbVar1;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uchar *limit;
  int iVar7;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar11;
  int iVar12;
  
  if (0 < num_edges) {
    pbVar3 = decoder->buf_;
    pbVar1 = decoder->limit_;
    paVar2 = &clipped->field_3;
    iVar6 = 0;
    iVar7 = 0;
    do {
      if (pbVar1 <= pbVar3) {
        return false;
      }
      uVar8 = *pbVar3 & 0x7f;
      pbVar10 = pbVar3 + 1;
      if ((char)*pbVar3 < '\0') {
        if (pbVar1 <= pbVar3 + 1) {
          return false;
        }
        uVar8 = uVar8 | (pbVar3[1] & 0x7f) << 7;
        pbVar10 = pbVar3 + 2;
        if ((char)pbVar3[1] < '\0') {
          if (pbVar1 <= pbVar3 + 2) {
            return false;
          }
          uVar8 = uVar8 | (pbVar3[2] & 0x7f) << 0xe;
          pbVar10 = pbVar3 + 3;
          if ((char)pbVar3[2] < '\0') {
            if (pbVar1 <= pbVar3 + 3) {
              return false;
            }
            uVar8 = uVar8 | (pbVar3[3] & 0x7f) << 0x15;
            pbVar10 = pbVar3 + 4;
            if ((char)pbVar3[3] < '\0') {
              if (pbVar1 <= pbVar3 + 4) {
                return false;
              }
              if (0xf < pbVar3[4]) {
                return false;
              }
              uVar8 = uVar8 | (uint)pbVar3[4] << 0x1c;
              pbVar10 = pbVar3 + 5;
            }
          }
        }
      }
      pbVar3 = pbVar10;
      decoder->buf_ = pbVar3;
      if (iVar6 + 1 == num_edges) {
        if (5 < *(uint *)&clipped->field_0x4) {
          paVar2 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(clipped->field_3).edges_;
        }
        *(uint *)((long)paVar2 + (long)iVar6 * 4) = uVar8 + iVar7;
        return true;
      }
      iVar12 = (uVar8 & 7) + 1;
      uVar8 = uVar8 >> 3;
      if (iVar12 == 8) {
        if (pbVar1 <= pbVar3) {
          return false;
        }
        pbVar10 = pbVar3 + 1;
        uVar4 = *pbVar3 & 0x7f;
        if ((char)*pbVar3 < '\0') {
          if (pbVar1 <= pbVar10) {
            return false;
          }
          pbVar10 = pbVar3 + 2;
          uVar4 = uVar4 | (pbVar3[1] & 0x7f) << 7;
          if ((char)pbVar3[1] < '\0') {
            if (pbVar1 <= pbVar10) {
              return false;
            }
            pbVar10 = pbVar3 + 3;
            uVar4 = uVar4 | (pbVar3[2] & 0x7f) << 0xe;
            if ((char)pbVar3[2] < '\0') {
              if (pbVar1 <= pbVar10) {
                return false;
              }
              pbVar10 = pbVar3 + 4;
              uVar4 = uVar4 | (pbVar3[3] & 0x7f) << 0x15;
              if ((char)pbVar3[3] < '\0') {
                if (pbVar1 <= pbVar10) {
                  return false;
                }
                if (0xf < pbVar3[4]) {
                  return false;
                }
                pbVar10 = pbVar3 + 5;
                uVar4 = uVar4 | (uint)pbVar3[4] << 0x1c;
              }
            }
          }
        }
        iVar12 = uVar8 + 8;
        decoder->buf_ = pbVar10;
        pbVar3 = pbVar10;
        uVar8 = uVar4;
      }
      iVar7 = iVar7 + uVar8;
      lVar9 = (long)iVar6 << 2;
      iVar5 = 0;
      do {
        paVar11 = paVar2;
        if (5 < *(uint *)&clipped->field_0x4) {
          paVar11 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(clipped->field_3).edges_;
        }
        *(int *)((long)paVar11 + lVar9) = iVar7;
        iVar7 = iVar7 + 1;
        lVar9 = lVar9 + 4;
        iVar5 = iVar5 + -1;
      } while (-iVar12 != iVar5);
      iVar6 = iVar6 - iVar5;
    } while (iVar6 < num_edges);
  }
  return true;
}

Assistant:

inline bool S2ShapeIndexCell::DecodeEdges(int num_edges,
                                          S2ClippedShape* clipped,
                                          Decoder* decoder) {
  // This function inverts the encodings documented above.
  int32 edge_id = 0;
  for (int i = 0; i < num_edges; ) {
    uint32 delta;
    if (!decoder->get_varint32(&delta)) return false;
    if (i + 1 == num_edges) {
      // The last edge is encoded without an edge count.
      clipped->set_edge(i++, edge_id + delta);
    } else {
      // Otherwise decode the count and edge delta.
      uint32 count = (delta & 7) + 1;
      delta >>= 3;
      if (count == 8) {
        count = delta + 8;
        if (!decoder->get_varint32(&delta)) return false;
      }
      edge_id += delta;
      for (; count > 0; --count, ++i, ++edge_id) {
        clipped->set_edge(i, edge_id);
      }
    }
  }
  return true;
}